

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_together.c
# Opt level: O0

int main(int argc,char **argv)

{
  int local_20;
  int local_1c;
  int i;
  int n_workers;
  char **argv_local;
  int argc_local;
  
  local_1c = 0;
  if (1 < argc) {
    local_1c = atoi(argv[1]);
  }
  lace_set_verbosity(1);
  for (local_20 = 0; local_20 < 5; local_20 = local_20 + 1) {
    runtests(local_1c);
  }
  return 0;
}

Assistant:

int
main (int argc, char *argv[])
{
    int n_workers = 0; // automatically detect number of workers

    if (argc > 1) {
        n_workers = atoi(argv[1]);
    }

    lace_set_verbosity(1);

    for (int i=0; i<5; i++) {
        runtests(n_workers);
    }

    return 0;
}